

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_math.h
# Opt level: O2

grisu3_diy_fp_t grisu3_diy_fp_multiply(grisu3_diy_fp_t x,grisu3_diy_fp_t y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  grisu3_diy_fp_t gVar6;
  
  uVar1 = x.f & 0xffffffff;
  uVar4 = x.f >> 0x20;
  uVar2 = y.f >> 0x20;
  uVar3 = uVar2 * uVar1;
  uVar5 = uVar4 * (uint)y.f;
  gVar6.f = ((uVar3 & 0xffffffff) + (uVar5 & 0xffffffff) + ((uint)y.f * uVar1 >> 0x20) + 0x80000000
            >> 0x20) + (uVar3 >> 0x20) + (uVar5 >> 0x20) + uVar2 * uVar4;
  gVar6.e = x.e + y.e + 0x40;
  gVar6._12_4_ = 0;
  return gVar6;
}

Assistant:

static grisu3_diy_fp_t grisu3_diy_fp_multiply(grisu3_diy_fp_t x, grisu3_diy_fp_t y)
{
    uint64_t a, b, c, d, ac, bc, ad, bd, tmp;
    grisu3_diy_fp_t r;
    a = x.f >> 32; b = x.f & GRISU3_MASK32;
    c = y.f >> 32; d = y.f & GRISU3_MASK32;
    ac = a*c; bc = b*c;
    ad = a*d; bd = b*d;
    tmp = (bd >> 32) + (ad & GRISU3_MASK32) + (bc & GRISU3_MASK32);
    tmp += 1U << 31; /* round */
    r.f = ac + (ad >> 32) + (bc >> 32) + (tmp >> 32);
    r.e = x.e + y.e + 64;
    return r;
}